

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::ExtractDebugVisitor::process_stmt(ExtractDebugVisitor *this,Stmt *stmt)

{
  bool bVar1;
  Generator *pGVar2;
  Generator *generator;
  Stmt *stmt_local;
  ExtractDebugVisitor *this_local;
  
  generator = (Generator *)stmt;
  stmt_local = (Stmt *)this;
  bVar1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::empty(&(stmt->super_IRNode).fn_name_ln);
  if ((!bVar1) && (pGVar2 = Stmt::generator_parent((Stmt *)generator), (pGVar2->debug & 1U) != 0)) {
    std::vector<kratos::Stmt_const*,std::allocator<kratos::Stmt_const*>>::
    emplace_back<kratos::Stmt*&>
              ((vector<kratos::Stmt_const*,std::allocator<kratos::Stmt_const*>> *)&this->stmts_,
               (Stmt **)&generator);
  }
  return;
}

Assistant:

inline void process_stmt(Stmt *stmt) {
        if (stmt->fn_name_ln.empty()) return;
        auto *generator = stmt->generator_parent();
        if (generator->debug) {
            stmts_.emplace_back(stmt);
        }
    }